

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

bool __thiscall
soplex::SPxSolverBase<double>::leave(SPxSolverBase<double> *this,int leaveIdx,bool polish)

{
  bool bVar1;
  UpdateVector<double> *pUVar2;
  SSVectorBase<double> *pSVar3;
  SSVectorBase<double> *pSVar4;
  SSVectorBase<double> *pSVar5;
  SLinSolver<double> *pSVar6;
  pointer pdVar7;
  pointer pdVar8;
  Tolerances *this_00;
  SVectorBase<double> *pSVar9;
  char cVar10;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar11;
  int iVar12;
  int extraout_var;
  undefined4 extraout_var_00;
  long lVar13;
  ulong uVar14;
  SPxOut *pSVar15;
  uint uVar16;
  int *piVar17;
  long lVar18;
  VectorBase<double> *pVVar19;
  SSVectorBase<double> *pSVar20;
  SSVectorBase<double> *x;
  ulong uVar21;
  long in_FS_OFFSET;
  Real RVar22;
  double dVar23;
  Status leaveStat;
  int leaveNum;
  double enterBound;
  double enterVal;
  double newUBbound;
  double leaveMax;
  SPxId enterId;
  SPxId leaveId;
  SPxId none;
  double leavebound;
  double newCoPrhs;
  double newLBbound;
  uint local_fc;
  SPxBasisBase<double> *local_f8;
  undefined8 uStack_f0;
  uint local_e0;
  uint local_dc;
  Verbosity local_d8;
  undefined4 uStack_d4;
  double local_d0;
  double local_c8;
  undefined8 uStack_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  double local_b0;
  DataKey local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  double local_90;
  double local_88;
  double dStack_80;
  long local_70;
  SSVectorBase<double> *local_68;
  double local_60;
  double local_58 [5];
  SVectorBase<double> *rhs;
  
  bVar1 = this->instableLeave;
  pUVar2 = this->theCoPvec;
  if (((pUVar2->thedelta).setupStatus == true) && ((pUVar2->thedelta).super_IdxSet.num == 0)) {
    SPxBasisBase<double>::coSolve
              (&this->super_SPxBasisBase<double>,&pUVar2->thedelta,
               &(this->unitVecs).data.
                super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[leaveIdx].super_SVectorBase<double>);
  }
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x86])(this);
  local_a0 = 0xffffffff00000000;
  local_98 = 0xffffffff00000000;
  local_88 = 0.0;
  dStack_80 = 0.0;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7f])
            (this,(ulong)(uint)leaveIdx,&local_fc,&local_a0,&local_b0,&local_90,&local_dc,&local_88)
  ;
  if ((!polish) && (this->m_maxCycle < this->m_numCycle)) {
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[(ulong)(0.0 < local_b0) + 0x8b])
              (this);
    this->m_nonbasicValue = 0.0;
    this->m_nonbasicValueUpToDate = false;
  }
  local_d0 = local_b0;
  this->boundflips = 0;
  local_f8 = (SPxBasisBase<double> *)this->theShift;
  local_a8.info =
       (*this->theratiotester->_vptr_SPxRatioTester[8])
                 (this->theratiotester,&local_d0,(ulong)(uint)leaveIdx,(ulong)polish);
  local_a8.idx = extraout_var;
  local_c8 = this->theShift;
  uStack_c0 = 0;
  RVar22 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  if (RVar22 < ABS(local_c8 - (double)local_f8)) {
    this->m_nonbasicValue = 0.0;
    this->m_nonbasicValueUpToDate = false;
  }
  this->instableLeaveNum = -1;
  this->instableLeave = false;
  if (local_a8.info == 0) {
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x85])
              (this,(ulong)local_dc,local_a0,(ulong)local_fc,0);
    (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
              (&this->super_SPxBasisBase<double>,0xffffffff,&local_98,0,0);
    local_88 = 0.0;
    dStack_80 = 0.0;
    if (polish) {
      return false;
    }
    local_f8 = (SPxBasisBase<double> *)(local_d0 - local_b0);
    uStack_f0 = 0;
    RVar22 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    if (RVar22 < ABS((double)local_f8) && (bVar1 & 1U) == 0) {
      pdVar7 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      this->instableLeaveNum = leaveIdx;
      dVar23 = pdVar7[leaveIdx];
      this->instableLeaveVal = dVar23;
      pdVar7[leaveIdx] = dVar23 / 10.0;
      return true;
    }
    if (1 < (this->super_SPxBasisBase<double>).updateCount) {
      pSVar15 = this->spxout;
      if ((pSVar15 != (SPxOut *)0x0) && (4 < (int)pSVar15->m_verbosity)) {
        local_b8 = 5;
        local_d8 = pSVar15->m_verbosity;
        (*pSVar15->_vptr_SPxOut[2])();
        pSVar15 = this->spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar15->m_streams[pSVar15->m_verbosity],"ILEAVE01 factorization triggered in ",
                   0x24);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar15->m_streams[pSVar15->m_verbosity],"leave() for feasibility test",0x1c);
        cVar10 = (char)pSVar15->m_streams[pSVar15->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar15->m_streams[pSVar15->m_verbosity] + -0x18) + cVar10)
        ;
        std::ostream::put(cVar10);
        std::ostream::flush();
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_d8);
      }
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x75])(this);
      return true;
    }
    if (this->recomputedVectors == false) {
      local_f8 = (SPxBasisBase<double> *)((ulong)local_d0 & 0x7fffffffffffffff);
      uStack_f0 = 0;
      dVar23 = leavetol(this);
      if ((double)local_f8 < dVar23) {
        pSVar15 = this->spxout;
        if ((pSVar15 != (SPxOut *)0x0) && (4 < (int)pSVar15->m_verbosity)) {
          local_b8 = 5;
          local_d8 = pSVar15->m_verbosity;
          (*pSVar15->_vptr_SPxOut[2])();
          pSVar15 = soplex::operator<<(this->spxout,
                                       "ILEAVE11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar15->m_streams[pSVar15->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_d8);
        }
        computeFrhs(this);
        SPxBasisBase<double>::solve
                  (&this->super_SPxBasisBase<double>,&this->theFvec->super_VectorBase<double>,
                   this->theFrhs);
        computeFtest(this);
        this->recomputedVectors = true;
        return true;
      }
    }
    pSVar15 = this->spxout;
    if ((pSVar15 != (SPxOut *)0x0) && (4 < (int)pSVar15->m_verbosity)) {
      local_b8 = 5;
      local_d8 = pSVar15->m_verbosity;
      (*pSVar15->_vptr_SPxOut[2])();
      pSVar15 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar15->m_streams[pSVar15->m_verbosity],
                 "ILEAVE02 unboundedness/infeasibility found ",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar15->m_streams[pSVar15->m_verbosity],"in leave()",10);
      cVar10 = (char)pSVar15->m_streams[pSVar15->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar15->m_streams[pSVar15->m_verbosity] + -0x18) + cVar10);
      std::ostream::put(cVar10);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_d8);
    }
    if (this->theRep == COLUMN) goto LAB_001d0e7a;
    goto LAB_001d10c8;
  }
  local_c8 = (double)CONCAT71(local_c8._1_7_,bVar1);
  lVar18 = (long)leaveIdx;
  if (&local_a8 == &(this->super_SPxBasisBase<double>).theBaseId.data[lVar18].super_DataKey) {
    (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
              (&this->super_SPxBasisBase<double>,(ulong)(uint)leaveIdx,&local_98,0,0);
    pDVar11 = &(this->super_SPxBasisBase<double>).thedesc.colstat;
    if ((int)local_a0 < 0) {
      pDVar11 = &(this->super_SPxBasisBase<double>).thedesc.rowstat;
    }
    lVar13 = (long)(int)local_dc;
    if (local_fc == 0xfffffffe) {
      pDVar11->data[lVar13] = P_ON_LOWER;
      pVVar19 = &this->theLCbound;
      if ((int)local_a0 < 0) {
        pVVar19 = &this->theLRbound;
      }
      (this->theCoPrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar18] =
           (pVVar19->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar13];
      (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar18] = 0.0;
      ::soplex::infinity::__tls_init();
      dVar23 = -*(double *)(in_FS_OFFSET + -8);
    }
    else {
      pVVar19 = &this->theUCbound;
      if ((int)local_a0 < 0) {
        pVVar19 = &this->theURbound;
      }
      pDVar11->data[lVar13] = P_ON_UPPER;
      (this->theCoPrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar18] =
           (pVVar19->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar13];
      ::soplex::infinity::__tls_init();
      (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar18] = *(double *)(in_FS_OFFSET + -8);
      dVar23 = 0.0;
    }
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar18] = dVar23;
    local_f8 = (SPxBasisBase<double> *)local_d0;
    this->theCoPvec->theval = local_d0;
    this->thePvec->theval = local_d0;
    RVar22 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    if (RVar22 < (double)local_f8) {
LAB_001d073f:
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x87])(this);
    }
    else {
      local_f8 = (SPxBasisBase<double> *)local_d0;
      RVar22 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if ((double)local_f8 < -RVar22) goto LAB_001d073f;
    }
    this->theFvec->theval = 0.0;
    pdVar7 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->m_pricingViol = pdVar7[lVar18] + this->m_pricingViol;
    pdVar7[lVar18] = -pdVar7[lVar18];
  }
  else {
    local_f8 = &this->super_SPxBasisBase<double>;
    local_e0 = leaveIdx;
    iVar12 = (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7e])(this,&local_a8);
    rhs = (SVectorBase<double> *)CONCAT44(extraout_var_00,iVar12);
    pSVar3 = this->solveVector2;
    pSVar4 = this->solveVector3;
    x = &this->theFvec->thedelta;
    if (pSVar3 == (SSVectorBase<double> *)0x0) {
      if (pSVar4 == (SSVectorBase<double> *)0x0) {
        SPxBasisBase<double>::solve4update(local_f8,x,rhs);
        goto LAB_001d085b;
      }
      pSVar3 = this->solveVector3rhs;
      if ((this->super_SPxBasisBase<double>).factorized == false) {
        SPxBasisBase<double>::factorize(local_f8);
      }
      pSVar6 = (this->super_SPxBasisBase<double>).factor;
      (*pSVar6->_vptr_SLinSolver[0x11])(pSVar6,x,pSVar4,rhs,pSVar3);
      pSVar3 = this->solveVector3;
      if (pSVar3->setupStatus == true) {
        lVar13 = (long)(pSVar3->super_IdxSet).num;
        uVar21 = (ulong)local_e0;
        if (0 < lVar13) {
          piVar17 = (pSVar3->super_IdxSet).idx;
          pdVar7 = (pSVar3->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (this->primVec).super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar14 = lVar13 + 1;
          do {
            iVar12 = piVar17[uVar14 - 2];
            pdVar8[iVar12] = pdVar8[iVar12] - pdVar7[iVar12];
            uVar14 = uVar14 - 1;
          } while (1 < uVar14);
        }
      }
      else {
        pdVar7 = (this->primVec).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar16 = (uint)((ulong)((long)(this->primVec).super_VectorBase<double>.val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pdVar7) >> 3);
        uVar21 = (ulong)local_e0;
        if (0 < (int)uVar16) {
          pdVar8 = (pSVar3->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar14 = (ulong)(uVar16 & 0x7fffffff) + 1;
          do {
            pdVar7[uVar14 + 0xfffffffffffffffe] =
                 pdVar7[uVar14 + 0xfffffffffffffffe] - pdVar8[uVar14 - 2];
            uVar14 = uVar14 - 1;
          } while (1 < uVar14);
        }
      }
LAB_001d0972:
      this->totalboundflips = this->totalboundflips + this->boundflips;
    }
    else {
      pSVar20 = this->solveVector2rhs;
      if (pSVar4 != (SSVectorBase<double> *)0x0) {
        pSVar5 = this->solveVector3rhs;
        local_70 = lVar18;
        if ((this->super_SPxBasisBase<double>).factorized == false) {
          local_68 = pSVar20;
          SPxBasisBase<double>::factorize(local_f8);
          pSVar20 = local_68;
        }
        pSVar6 = (this->super_SPxBasisBase<double>).factor;
        (*pSVar6->_vptr_SLinSolver[0x13])(pSVar6,x,pSVar3,pSVar4,rhs,pSVar20,pSVar5);
        pSVar3 = this->solveVector3;
        lVar18 = local_70;
        if (pSVar3->setupStatus == true) {
          lVar13 = (long)(pSVar3->super_IdxSet).num;
          uVar21 = (ulong)local_e0;
          if (0 < lVar13) {
            piVar17 = (pSVar3->super_IdxSet).idx;
            pdVar7 = (pSVar3->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar8 = (this->primVec).super_VectorBase<double>.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar14 = lVar13 + 1;
            do {
              iVar12 = piVar17[uVar14 - 2];
              pdVar8[iVar12] = pdVar8[iVar12] - pdVar7[iVar12];
              uVar14 = uVar14 - 1;
            } while (1 < uVar14);
          }
        }
        else {
          pdVar7 = (this->primVec).super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar16 = (uint)((ulong)((long)(this->primVec).super_VectorBase<double>.val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)pdVar7) >> 3);
          uVar21 = (ulong)local_e0;
          if (0 < (int)uVar16) {
            pdVar8 = (pSVar3->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar14 = (ulong)(uVar16 & 0x7fffffff) + 1;
            do {
              pdVar7[uVar14 + 0xfffffffffffffffe] =
                   pdVar7[uVar14 + 0xfffffffffffffffe] - pdVar8[uVar14 - 2];
              uVar14 = uVar14 - 1;
            } while (1 < uVar14);
          }
        }
        goto LAB_001d0972;
      }
      if ((this->super_SPxBasisBase<double>).factorized == false) {
        SPxBasisBase<double>::factorize(local_f8);
      }
      pSVar6 = (this->super_SPxBasisBase<double>).factor;
      (*pSVar6->_vptr_SLinSolver[0x11])(pSVar6,x,pSVar3,rhs,pSVar20);
LAB_001d085b:
      uVar21 = (ulong)local_e0;
    }
    this_00 = (this->super_SPxLPBase<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar23 = this_00->s_epsilon_multiplier;
    uVar14 = -(ulong)(dVar23 == 1.0);
    if (ABS((this->theFvec->thedelta).super_VectorBase<double>.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar18]) <
        (double)(~uVar14 & (ulong)(dVar23 * 1e-10) | uVar14 & 0x3ddb7cdfd9d7bdbb)) {
      if (local_c8._0_1_ == '\0') {
        SSVectorBase<double>::clear(&this->theFvec->thedelta);
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x85])
                  (this,(ulong)local_dc,local_a0,(ulong)local_fc,rhs);
        (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)(local_f8,0xffffffff,&local_98,0,0)
        ;
        pdVar7 = (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7[lVar18] = pdVar7[lVar18] * 0.01;
        return true;
      }
      pSVar15 = this->spxout;
      if ((pSVar15 != (SPxOut *)0x0) && (4 < (int)pSVar15->m_verbosity)) {
        local_b8 = 5;
        local_d8 = pSVar15->m_verbosity;
        (*pSVar15->_vptr_SPxOut[2])();
        pSVar15 = this->spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar15->m_streams[pSVar15->m_verbosity],
                   "ILEAVE03 unboundedness/infeasibility found ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar15->m_streams[pSVar15->m_verbosity],"in leave()",10);
        cVar10 = (char)pSVar15->m_streams[pSVar15->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar15->m_streams[pSVar15->m_verbosity] + -0x18) + cVar10)
        ;
        std::ostream::put(cVar10);
        std::ostream::flush();
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_d8);
      }
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x85])
                (this,(ulong)local_dc,local_a0,(ulong)local_fc,0);
      (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)(local_f8,0xffffffff,&local_98,0,0);
      local_88 = 0.0;
      dStack_80 = 0.0;
      if (this->theRep != ROW) {
LAB_001d0e7a:
        computeDualfarkas4Col(this,local_d0);
        if (this->m_status == OPTIMAL) {
          this->m_status = UNKNOWN;
        }
        if ((this->super_SPxBasisBase<double>).thestatus == INFEASIBLE) {
          return false;
        }
        (this->super_SPxBasisBase<double>).thestatus = INFEASIBLE;
        return false;
      }
LAB_001d10c8:
      computePrimalray4Row(this,local_d0);
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      if ((this->super_SPxBasisBase<double>).thestatus != UNBOUNDED) {
        (this->super_SPxBasisBase<double>).thestatus = UNBOUNDED;
      }
      return false;
    }
    local_c8 = local_90;
    RVar22 = Tolerances::epsilon(this_00);
    if (RVar22 < local_c8) {
LAB_001d0a1c:
      pSVar9 = (this->super_SPxBasisBase<double>).matrix.data[lVar18];
      lVar13 = (long)pSVar9->memused;
      if (0 < lVar13) {
        pdVar7 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar14 = lVar13 + 1;
        piVar17 = &pSVar9->m_elem[lVar13 + -1].idx;
        do {
          pdVar7[*piVar17] = pdVar7[*piVar17] - ((Nonzero<double> *)(piVar17 + -2))->val * local_90;
          uVar14 = uVar14 - 1;
          piVar17 = piVar17 + -4;
        } while (1 < uVar14);
      }
    }
    else {
      local_c8 = local_90;
      RVar22 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (local_c8 < -RVar22) goto LAB_001d0a1c;
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x80])
              (local_b0,this,local_a8,&local_d8,&local_b8,local_58,&local_60,&local_88);
    (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar18] = (double)CONCAT44(uStack_b4,local_b8);
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar18] = local_58[0];
    (this->theCoPrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar18] = local_60;
    local_c8 = (double)CONCAT44(uStack_d4,local_d8);
    RVar22 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    if (RVar22 < local_c8) {
LAB_001d0b47:
      lVar13 = (long)rhs->memused;
      if (0 < lVar13) {
        pdVar7 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar14 = lVar13 + 1;
        piVar17 = &rhs->m_elem[lVar13 + -1].idx;
        do {
          pdVar7[*piVar17] =
               (double)CONCAT44(uStack_d4,local_d8) * ((Nonzero<double> *)(piVar17 + -2))->val +
               pdVar7[*piVar17];
          uVar14 = uVar14 - 1;
          piVar17 = piVar17 + -4;
        } while (1 < uVar14);
      }
    }
    else {
      local_c8 = (double)CONCAT44(uStack_d4,local_d8);
      RVar22 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (local_c8 < -RVar22) goto LAB_001d0b47;
    }
    local_c8 = local_d0;
    this->theCoPvec->theval = local_d0;
    this->thePvec->theval = local_d0;
    RVar22 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    if (RVar22 < local_c8) {
LAB_001d0bf5:
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x87])(this);
    }
    else {
      local_c8 = local_d0;
      RVar22 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (local_c8 < -RVar22) goto LAB_001d0bf5;
    }
    pUVar2 = this->theFvec;
    pUVar2->theval =
         -((pUVar2->super_VectorBase<double>).val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar18] - local_90) /
         (pUVar2->thedelta).super_VectorBase<double>.val.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[lVar18];
    UpdateVector<double>::update(pUVar2);
    (this->theFvec->super_VectorBase<double>).val.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [lVar18] = (double)CONCAT44(uStack_d4,local_d8) - this->theFvec->theval;
    updateFtest(this);
    if (this->m_nonbasicValueUpToDate == true) {
      this->m_nonbasicValue = local_88 + dStack_80 + this->m_nonbasicValue;
      nonbasicValue(this);
    }
    (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
              (local_f8,uVar21,&local_a8,rhs,&this->theFvec->thedelta);
  }
  local_f8 = (SPxBasisBase<double> *)local_b0;
  dVar23 = entertol(this);
  if (dVar23 < (double)local_f8) {
    local_f8 = (SPxBasisBase<double> *)local_d0;
    dVar23 = entertol(this);
    if ((double)local_f8 <= dVar23) goto LAB_001d0eae;
  }
  local_f8 = (SPxBasisBase<double> *)local_b0;
  dVar23 = entertol(this);
  if ((double)local_f8 < -dVar23) {
    local_f8 = (SPxBasisBase<double> *)local_d0;
    dVar23 = entertol(this);
    if (-dVar23 <= (double)local_f8) {
LAB_001d0eae:
      local_f8 = (SPxBasisBase<double> *)
                 (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar18];
      ::soplex::infinity::__tls_init();
      if (*(double *)(in_FS_OFFSET + -8) <= (double)local_f8) {
        local_c8 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar18];
        uStack_f0 = 0;
        local_f8 = (SPxBasisBase<double> *)*(double *)(in_FS_OFFSET + -8);
        ::soplex::infinity::__tls_init();
        if (local_c8 <= -(double)local_f8 || local_fc == 0xffffffff) {
          return true;
        }
      }
      else if (local_fc == 0xffffffff) {
        return true;
      }
      if (local_fc != 1) {
        this->m_numCycle = this->m_numCycle + 1;
        this->leaveCycles = this->leaveCycles + 1;
        return true;
      }
      return true;
    }
  }
  this->m_numCycle = this->m_numCycle / 2;
  return true;
}

Assistant:

bool SPxSolverBase<R>::leave(int leaveIdx, bool polish)
{
   assert(leaveIdx < dim() && leaveIdx >= 0);
   assert(type() == LEAVE);
   assert(initialized);

   bool instable = instableLeave;
   assert(!instable || instableLeaveNum >= 0);

   /*
     Before performing the actual basis update, we must determine, how this
     is to be accomplished.
     When using steepest edge pricing this solve is already performed by the pricer
   */
   if(theCoPvec->delta().isSetup() && theCoPvec->delta().size() == 0)
   {
      this->coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);
   }

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      SSVectorBase<R>  tmp(dim(), this->tolerances());
      tmp.clear();
      this->coSolve(tmp, unitVecs[leaveIdx]);
      tmp -= theCoPvec->delta();

      if(tmp.length() > leavetol())
      {
         // This happens very frequently and does usually not hurt, so print
         // these warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE60 iteration=" << basis().iteration()
                       << ": coPvec.delta error = " << tmp.length()
                       << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   setupPupdate();

   assert(thePvec->isConsistent());
   assert(theCoPvec->isConsistent());

   typename SPxBasisBase<R>::Desc::Status leaveStat;      // status of leaving var
   SPxId leaveId;        // id of leaving var
   SPxId none;           // invalid id used if leave fails
   R leaveMax;       // maximium lambda of leaving var
   R leavebound;     // current fVec value of leaving var
   int  leaveNum;       // number of leaveId in bounds
   StableSum<R> objChange; // amount of change in the objective function

   getLeaveVals(leaveIdx, leaveStat, leaveId, leaveMax, leavebound, leaveNum, objChange);

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(leaveMax > 0)
         perturbMaxLeave();
      else
         perturbMinLeave();

      //@ m_numCycle /= 2;
      // perturbation invalidates the currently stored nonbasic value
      forceRecompNonbasicValue();
   }

   //@ testBounds();

   R enterVal = leaveMax;
   boundflips = 0;
   R oldShift = theShift;
   SPxId enterId = theratiotester->selectEnter(enterVal, leaveIdx, polish);

   if(NE(theShift, oldShift, this->tolerances()->epsilon()))
   {
      SPxOut::debug(this,
                    "DLEAVE71 trigger recomputation of nonbasic value due to shifts in ratiotest\n");
      forceRecompNonbasicValue();
   }

   assert(!enterId.isValid() || !isBasic(enterId));

   instableLeaveNum = -1;
   instableLeave = false;

   /*
     No variable could be selected to enter the basis and even the leaving
     variable is unbounded.
   */
   if(!enterId.isValid())
   {
      /* the following line originally was below in "rejecting leave" case;
         we need it in the unbounded/infeasible case, too, to have the
         correct basis size */
      rejectLeave(leaveNum, leaveId, leaveStat);
      this->change(-1, none, nullptr);
      objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

      if(polish)
         return false;

      if(NE(enterVal, leaveMax, this->tolerances()->epsilon()))
      {
         SPxOut::debug(this, "DLEAVE61 rejecting leave A (leaveIdx={}, theCoTest={})\n", leaveIdx,
                       theCoTest[leaveIdx]);

         /* In the LEAVE algorithm, when for a selected leaving variable we find only
            an instable entering variable, then the basis change is not conducted.
            Instead, we save the leaving variable's index in instableLeaveNum and scale
            theCoTest[leaveIdx] down by some factor, hoping to find a different leaving
            variable with a stable entering variable.
            If this fails, however, and no more leaving variable is found, we have to
            perform the instable basis change using instableLeaveNum. In this (and only
            in this) case, the flag instableLeave is set to true.

            enterVal != leaveMax is the case that selectEnter has found only an instable entering
            variable. We store this leaving variable for later -- if we are not already in the
            instable case: then we continue and conclude unboundedness/infeasibility */
         if(!instable)
         {
            instableLeaveNum = leaveIdx;

            // Note: These changes do not survive a refactorization
            instableLeaveVal = theCoTest[leaveIdx];
            theCoTest[leaveIdx] = instableLeaveVal / 10.0;

            return true;
         }
      }

      if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE01 factorization triggered in "
                       << "leave() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the leaving column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return true;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation */
      if(!recomputedVectors && spxAbs(enterVal) < leavetol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "ILEAVE11 clean up step to reduce numerical errors" <<
                       std::endl;)

         computeFrhs();
         SPxBasisBase<R>::solve(*theFvec, *theFrhs);
         computeFtest();

         /* only do this once per solve */
         recomputedVectors = true;

         return true;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE02 unboundedness/infeasibility found "
                    << "in leave()" << std::endl;)

      if(rep() != COLUMN)
      {
         computePrimalray4Row(enterVal);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }
      else
      {
         computeDualfarkas4Col(enterVal);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }

      return false;
   }
   else
   {
      /*
        If an entering variable has been found, a regular basis update is to
        be performed.
      */
      if(enterId != this->baseId((leaveIdx)))
      {
         const SVectorBase<R>& newVector = *enterVector(enterId);

         // update feasibility vectors
         if(solveVector2 != nullptr && solveVector3 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          *solveVector3,
                                          newVector,
                                          *solveVector2rhs,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else if(solveVector2 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());

            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          newVector,
                                          *solveVector2rhs);
         }
         else if(solveVector3 != nullptr)
         {
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector3,
                                          newVector,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else
            SPxBasisBase<R>::solve4update(theFvec->delta(), newVector);

#ifdef ENABLE_ADDITIONAL_CHECKS
         {
            SSVectorBase<R>  tmp(dim(), this->tolerances());
            SPxBasisBase<R>::solve(tmp, newVector);
            tmp -= fVec().delta();

            if(tmp.length() > entertol())
            {
               // This happens very frequently and does usually not hurt, so print
               // these warnings only with verbose level INFO2 and higher.
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE62\t(" << tmp.length() << ")\n";)
            }
         }
#endif  // ENABLE_ADDITIONAL_CHECKS

         R reject_treshold = this->tolerances()->scaleAccordingToEpsilon(default_reject_leave_tol);

         if(spxAbs(theFvec->delta()[leaveIdx]) < reject_treshold)
         {
            if(instable)
            {
               /* We are in the case that for all leaving variables only instable entering
                  variables were found: Thus, above we already accepted such an instable
                  entering variable. Now even this seems to be impossible, thus we conclude
                  unboundedness/infeasibility. */
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE03 unboundedness/infeasibility found "
                             << "in leave()" << std::endl;)

               rejectLeave(leaveNum, leaveId, leaveStat);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               /**@todo if shift() is not zero we must not conclude unboundedness */
               if(rep() == ROW)
               {
                  computePrimalray4Row(enterVal);
                  setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
               }
               else
               {
                  computeDualfarkas4Col(enterVal);
                  setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
               }

               return false;
            }
            else
            {
               theFvec->delta().clear();
               rejectLeave(leaveNum, leaveId, leaveStat, &newVector);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               SPxOut::debug(this, "DLEAVE63 rejecting leave B (leaveIdx={}, theCoTest={})\n", leaveIdx,
                             theCoTest[leaveIdx]);

               // Note: These changes do not survive a refactorization
               theCoTest[leaveIdx] *= 0.01;

               return true;
            }
         }

         //      process leaving variable
         if(leavebound > epsilon() || leavebound < -epsilon())
            theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

         //      process entering variable
         R enterBound;
         R newUBbound;
         R newLBbound;
         R newCoPrhs;

         try
         {
            getLeaveVals2(leaveMax, enterId, enterBound, newUBbound, newLBbound, newCoPrhs, objChange);
         }
         catch(const SPxException& F)
         {
            rejectLeave(leaveNum, leaveId, leaveStat);
            this->change(-1, none, nullptr);
            objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case
            throw F;
         }

         theUBbound[leaveIdx] = newUBbound;
         theLBbound[leaveIdx] = newLBbound;
         (*theCoPrhs)[leaveIdx] = newCoPrhs;

         if(enterBound > epsilon() || enterBound < -epsilon())
            theFrhs->multAdd(enterBound, newVector);

         // update pricing vectors
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vector
         theFvec->value() = -((*theFvec)[leaveIdx] - leavebound)
                            / theFvec->delta()[leaveIdx];
         theFvec->update();
         (*theFvec)[leaveIdx] = enterBound - theFvec->value();
         updateFtest();

         // update objective funtion value
         updateNonbasicValue(objChange);

         //  change basis matrix
         this->change(leaveIdx, enterId, &newVector, &(theFvec->delta()));
      }

      /*
        No entering vector has been selected from the basis. However, if the
        shift amount for |coPvec| is bounded, we are in the case, that the
        entering variable is moved from one bound to its other, before any of
        the basis feasibility variables reaches their bound. This may only
        happen in primal/columnwise case with upper and lower bounds on
        variables.
      */
      else
      {
         // @todo update obj function value here!!!
         assert(rep() == ROW);
         typename SPxBasisBase<R>::Desc& ds = this->desc();

         this->change(leaveIdx, none, nullptr);

         if(leaveStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
         {
            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLRbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLCbound[leaveNum];
            }

            theUBbound[leaveIdx] = 0;
            theLBbound[leaveIdx] = R(-infinity);
         }
         else
         {
            assert(leaveStat == SPxBasisBase<R>::Desc::P_ON_LOWER);

            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theURbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theUCbound[leaveNum];
            }

            theUBbound[leaveIdx] = R(infinity);
            theLBbound[leaveIdx] = 0;
         }

         // update copricing vector
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vectors
         theFvec->value() = 0;
         assert(theCoTest[leaveIdx] < 0.0);
         m_pricingViol += theCoTest[leaveIdx];
         theCoTest[leaveIdx] *= -1;
      }

      if((leaveMax > entertol() && enterVal <= entertol()) || (leaveMax < -entertol()
            && enterVal >= -entertol()))
      {
         if((theUBbound[leaveIdx] < R(infinity) || theLBbound[leaveIdx] > R(-infinity))
               && leaveStat != SPxBasisBase<R>::Desc::P_FREE
               && leaveStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            leaveCycles++;
         }
      }
      else
         m_numCycle /= 2;

#ifdef ENABLE_ADDITIONAL_CHECKS
      {
         VectorBase<R> tmp = fVec();
         this->multBaseWith(tmp);
         tmp -= fRhs();

         if(tmp.length() > entertol())
         {
            // This happens very frequently and does usually not hurt, so print
            // these warnings only with verbose level INFO2 and higher.
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE64\t" << basis().iteration()
                          << ": fVec error = " << tmp.length() << std::endl;)
            SPxBasisBase<R>::solve(tmp, fRhs());
            tmp -= fVec();
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE65\t(" << tmp.length() << ")\n";)
         }
      }
#endif  // ENABLE_ADDITIONAL_CHECKS

      return true;
   }
}